

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtext.c
# Opt level: O1

char * TextToSnake(char *text)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  memset(TextToSnake::buffer,0,0x400);
  if (text != (char *)0x0) {
    do {
      cVar1 = *text;
      if (cVar1 == '\0') {
        return TextToSnake::buffer;
      }
      uVar2 = uVar3;
      if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        if (0 < (int)uVar3) {
          TextToSnake::buffer[uVar3] = '_';
          uVar2 = uVar3 + 1;
        }
        cVar1 = *text + ' ';
      }
      TextToSnake::buffer[(int)uVar2] = cVar1;
      uVar3 = uVar2 + 1;
      text = text + 1;
    } while ((int)uVar2 < 0x3fe);
  }
  return TextToSnake::buffer;
}

Assistant:

const char *TextToSnake(const char *text)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = {0};
    memset(buffer, 0, MAX_TEXT_BUFFER_LENGTH);

    if (text != NULL)
    {
        // Check for next separator to upper case another character
        for (int i = 0, j = 0; (i < MAX_TEXT_BUFFER_LENGTH - 1) && (text[j] != '\0'); i++, j++)
        {
            if ((text[j] >= 'A') && (text[j] <= 'Z'))
            {
                if (i >= 1)
                {
                    buffer[i] = '_';
                    i++;
                }
                buffer[i] = text[j] + 32;
            }
            else buffer[i] = text[j];
        }
    }

    return buffer;
}